

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tet_jac_dquality_dnode0
          (REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_3b0;
  double local_3a0;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL pow_vim;
  REF_DBL sqrt_det;
  REF_DBL d_num [3];
  REF_DBL d_l2 [3];
  double local_318;
  REF_DBL d_e2 [3];
  double local_2f8;
  REF_DBL d_e1 [3];
  double local_2d8;
  REF_DBL d_e0 [3];
  REF_DBL temp;
  REF_DBL d_volume [3];
  REF_DBL num;
  REF_DBL volume_in_metric;
  REF_DBL volume;
  REF_DBL det;
  REF_DBL l2;
  double dStack_268;
  REF_INT i;
  REF_DBL e5 [3];
  double local_248;
  REF_DBL e4 [3];
  double local_228;
  REF_DBL e3 [3];
  double local_208;
  REF_DBL e2 [3];
  double local_1e8;
  REF_DBL e1 [3];
  double local_1c8;
  REF_DBL e0 [3];
  REF_DBL local_1a8;
  REF_DBL jac [9];
  double local_158;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog3 [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  REF_DBL *d_quality_local;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  ref_node_local._4_4_ = ref_node_tet_dvol_dnode0(ref_node,nodes,&volume_in_metric,&temp);
  if (ref_node_local._4_4_ == 0) {
    if (ref_node->min_volume < volume_in_metric) {
      ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,*nodes,mlog1 + 5);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[1],mlog2 + 5);
        if (ref_node_local._4_4_ == 0) {
          ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[2],mlog3 + 5);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[3],mlog + 5);
            if (ref_node_local._4_4_ == 0) {
              for (l2._4_4_ = 0; l2._4_4_ < 6; l2._4_4_ = l2._4_4_ + 1) {
                m[(long)l2._4_4_ + 5] =
                     (mlog1[(long)l2._4_4_ + 5] + mlog2[(long)l2._4_4_ + 5] +
                      mlog3[(long)l2._4_4_ + 5] + mlog[(long)l2._4_4_ + 5]) / 4.0;
              }
              ref_node_local._4_4_ = ref_matrix_exp_m(m + 5,&local_158);
              if (ref_node_local._4_4_ == 0) {
                ref_node_local._4_4_ = ref_matrix_jacob_m(&local_158,&local_1a8);
                if (ref_node_local._4_4_ == 0) {
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e0[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[1] * 0xf] -
                         ref_node->real[l2._4_4_ + *nodes * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e1[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[2] * 0xf] -
                         ref_node->real[l2._4_4_ + *nodes * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e2[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[3] * 0xf] -
                         ref_node->real[l2._4_4_ + *nodes * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e3[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[2] * 0xf] -
                         ref_node->real[l2._4_4_ + nodes[1] * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e4[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[3] * 0xf] -
                         ref_node->real[l2._4_4_ + nodes[1] * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    *(double *)((long)&stack0xfffffffffffffd98 + (long)l2._4_4_ * 8) =
                         ref_node->real[l2._4_4_ + nodes[3] * 0xf] -
                         ref_node->real[l2._4_4_ + nodes[2] * 0xf];
                  }
                  det = e0[1] * (m[4] * e0[1] + m[1] * local_1c8 + m[3] * e0[0]) +
                        local_1c8 * (m[1] * e0[1] + local_158 * local_1c8 + m[0] * e0[0]) +
                        e0[0] * (m[3] * e0[1] + m[0] * local_1c8 + m[2] * e0[0]) +
                        e1[1] * (m[4] * e1[1] + m[1] * local_1e8 + m[3] * e1[0]) +
                        local_1e8 * (m[1] * e1[1] + local_158 * local_1e8 + m[0] * e1[0]) +
                        e1[0] * (m[3] * e1[1] + m[0] * local_1e8 + m[2] * e1[0]) +
                        e2[1] * (m[4] * e2[1] + m[1] * local_208 + m[3] * e2[0]) +
                        local_208 * (m[1] * e2[1] + local_158 * local_208 + m[0] * e2[0]) +
                        e2[0] * (m[3] * e2[1] + m[0] * local_208 + m[2] * e2[0]) +
                        e3[1] * (m[4] * e3[1] + m[1] * local_228 + m[3] * e3[0]) +
                        local_228 * (m[1] * e3[1] + local_158 * local_228 + m[0] * e3[0]) +
                        e3[0] * (m[3] * e3[1] + m[0] * local_228 + m[2] * e3[0]) +
                        e4[1] * (m[4] * e4[1] + m[1] * local_248 + m[3] * e4[0]) +
                        local_248 * (m[1] * e4[1] + local_158 * local_248 + m[0] * e4[0]) +
                        e4[0] * (m[3] * e4[1] + m[0] * local_248 + m[2] * e4[0]) +
                        e5[1] * (m[4] * e5[1] + m[1] * dStack_268 + m[3] * e5[0]) +
                        dStack_268 * (m[1] * e5[1] + local_158 * dStack_268 + m[0] * e5[0]) +
                        e5[0] * (m[3] * e5[1] + m[0] * dStack_268 + m[2] * e5[0]);
                  ref_node_local._4_4_ =
                       ref_matrix_vt_m_v_deriv(&local_158,&local_1c8,d_e0 + 2,&local_2d8);
                  if (ref_node_local._4_4_ == 0) {
                    ref_node_local._4_4_ =
                         ref_matrix_vt_m_v_deriv(&local_158,&local_1e8,d_e0 + 2,&local_2f8);
                    if (ref_node_local._4_4_ == 0) {
                      ref_node_local._4_4_ =
                           ref_matrix_vt_m_v_deriv(&local_158,&local_208,d_e0 + 2,&local_318);
                      if (ref_node_local._4_4_ == 0) {
                        ref_node_local._4_4_ = ref_matrix_det_m(&local_158,&volume);
                        if (ref_node_local._4_4_ == 0) {
                          dVar1 = sqrt(volume);
                          dVar2 = pow(dVar1 * volume_in_metric,0.6666666666666666);
                          dVar3 = pow(dVar1 * volume_in_metric,-0.3333333333333333);
                          if (det * 1e+20 <= 0.0) {
                            local_3a0 = -(det * 1e+20);
                          }
                          else {
                            local_3a0 = det * 1e+20;
                          }
                          local_3b0 = dVar2;
                          if (dVar2 <= 0.0) {
                            local_3b0 = -dVar2;
                          }
                          if (local_3a0 <= local_3b0) {
                            *quality = -1.0;
                            *d_quality = 0.0;
                            d_quality[1] = 0.0;
                            d_quality[2] = 0.0;
                          }
                          else {
                            *quality = (dVar2 * 24.9610058766228) / det;
                            *d_quality = ((dVar3 * 0.6666666666666666 * dVar1 * temp * det +
                                          -(dVar2 * ((-local_2d8 - local_2f8) - local_318))) *
                                         24.9610058766228) / (det * det);
                            d_quality[1] = ((dVar3 * 0.6666666666666666 * dVar1 * d_volume[0] * det
                                            + -(dVar2 * ((-d_e0[0] - d_e1[0]) - d_e2[0]))) *
                                           24.9610058766228) / (det * det);
                            d_quality[2] = ((dVar3 * 0.6666666666666666 * dVar1 * d_volume[1] * det
                                            + -(dVar2 * ((-d_e0[1] - d_e1[1]) - d_e2[1]))) *
                                           24.9610058766228) / (det * det);
                          }
                          ref_node_local._4_4_ = 0;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x729,"ref_node_tet_jac_dquality_dnode0",
                                 (ulong)ref_node_local._4_4_,"det(mavg)");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                               ,0x724,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_
                               ,"d_e2");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x723,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,
                             "d_e1");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x722,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,
                           "d_e0");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x709,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"jac"
                        );
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x708,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"exp");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x705,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"log3");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x704,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"log2");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x703,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"log1");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x702,"ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"log0");
      }
    }
    else {
      *quality = volume_in_metric - ref_node->min_volume;
      for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
        d_quality[l2._4_4_] = d_volume[(long)l2._4_4_ + -1];
      }
      ref_node_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x6fb,
           "ref_node_tet_jac_dquality_dnode0",(ulong)ref_node_local._4_4_,"vol");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_tet_jac_dquality_dnode0(REF_NODE ref_node,
                                                           REF_INT *nodes,
                                                           REF_DBL *quality,
                                                           REF_DBL *d_quality) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6], mlog3[6];
  REF_DBL mlog[6], m[6], jac[9];
  REF_DBL e0[3], e1[3], e2[3], e3[3], e4[3], e5[3];
  REF_INT i;

  REF_DBL l2, det, volume, volume_in_metric, num;
  REF_DBL d_volume[3];
  REF_DBL temp, d_e0[3], d_e1[3], d_e2[3], d_l2[3], d_num[3];
  REF_DBL sqrt_det, pow_vim;

  RSS(ref_node_tet_dvol_dnode0(ref_node, nodes, &volume, d_volume), "vol");
  if (volume <= ref_node_min_volume(ref_node)) {
    *quality = volume - ref_node_min_volume(ref_node);
    for (i = 0; i < 3; i++) d_quality[i] = d_volume[i];
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  RSS(ref_node_metric_get_log(ref_node, nodes[3], mlog3), "log3");
  for (i = 0; i < 6; i++)
    mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i] + mlog3[i]) / 4.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_jacob_m(m, jac), "jac");

  for (i = 0; i < 3; i++)
    e0[i] = ref_node_xyz(ref_node, i, nodes[1]) -
            ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    e1[i] = ref_node_xyz(ref_node, i, nodes[2]) -
            ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    e2[i] = ref_node_xyz(ref_node, i, nodes[3]) -
            ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    e3[i] = ref_node_xyz(ref_node, i, nodes[2]) -
            ref_node_xyz(ref_node, i, nodes[1]);
  for (i = 0; i < 3; i++)
    e4[i] = ref_node_xyz(ref_node, i, nodes[3]) -
            ref_node_xyz(ref_node, i, nodes[1]);
  for (i = 0; i < 3; i++)
    e5[i] = ref_node_xyz(ref_node, i, nodes[3]) -
            ref_node_xyz(ref_node, i, nodes[2]);

  l2 = ref_matrix_vt_m_v(m, e0) + ref_matrix_vt_m_v(m, e1) +
       ref_matrix_vt_m_v(m, e2) + ref_matrix_vt_m_v(m, e3) +
       ref_matrix_vt_m_v(m, e4) + ref_matrix_vt_m_v(m, e5);

  RSS(ref_matrix_vt_m_v_deriv(m, e0, &temp, d_e0), "d_e0");
  RSS(ref_matrix_vt_m_v_deriv(m, e1, &temp, d_e1), "d_e1");
  RSS(ref_matrix_vt_m_v_deriv(m, e2, &temp, d_e2), "d_e2");
  d_l2[0] = -d_e0[0] - d_e1[0] - d_e2[0];
  d_l2[1] = -d_e0[1] - d_e1[1] - d_e2[1];
  d_l2[2] = -d_e0[2] - d_e1[2] - d_e2[2];

  RSS(ref_matrix_det_m(m, &det), "det(mavg)");
  sqrt_det = sqrt(det);
  volume_in_metric = sqrt_det * volume;

  num = pow(volume_in_metric, 2.0 / 3.0);

  pow_vim = pow(volume_in_metric, -1.0 / 3.0);
  d_num[0] = (2.0 / 3.0) * pow_vim * sqrt_det * d_volume[0];
  d_num[1] = (2.0 / 3.0) * pow_vim * sqrt_det * d_volume[1];
  d_num[2] = (2.0 / 3.0) * pow_vim * sqrt_det * d_volume[2];

  if (ref_math_divisible(num, l2)) {
    /* 36/3^(1/3) */
    *quality = 24.9610058766228 * num / l2;
    d_quality[0] =
        24.9610058766228 * (d_num[0] * l2 - num * d_l2[0]) / (l2 * l2);
    d_quality[1] =
        24.9610058766228 * (d_num[1] * l2 - num * d_l2[1]) / (l2 * l2);
    d_quality[2] =
        24.9610058766228 * (d_num[2] * l2 - num * d_l2[2]) / (l2 * l2);
  } else {
    /* printf("%s: %d: %s: div zero vol %.18e (%.18e / %.18e)\n", __FILE__,
       __LINE__, __func__, volume, num, l2); */
    *quality = -1.0;
    d_quality[0] = 0.0;
    d_quality[1] = 0.0;
    d_quality[2] = 0.0;
  }

  return REF_SUCCESS;
}